

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arm_regression.c
# Opt level: O3

void snprint_insn_detail(char *buf,size_t *cur,size_t *left,cs_insn *ins)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *__s;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  
  if (ins != (cs_insn *)0x0) {
    if (ins->op_str[0xe] != '\0') {
      iVar3 = snprintf(buf + *cur,*left,"\top_count: %u\n");
      *left = *left - (long)iVar3;
      *cur = *cur + (long)iVar3;
      if (ins->op_str[0xe] != '\0') {
        pcVar8 = ins->op_str + 0x32;
        uVar7 = 0;
        do {
          uVar1 = *(uint *)(pcVar8 + -0x10);
          switch(uVar1) {
          case 1:
            sVar5 = *cur;
            sVar2 = *left;
            pcVar4 = cs_reg_name(handle,*(uint *)(pcVar8 + -0xc));
            iVar3 = snprintf(buf + sVar5,sVar2,"\t\toperands[%u].type: REG = %s\n",
                             uVar7 & 0xffffffff,pcVar4);
            break;
          case 2:
            __s = buf + *cur;
            sVar5 = *left;
            uVar6 = (ulong)*(uint *)(pcVar8 + -0xc);
            pcVar4 = "\t\toperands[%u].type: IMM = 0x%x\n";
            goto LAB_001438de;
          case 3:
            iVar3 = snprintf(buf + *cur,*left,"\t\toperands[%u].type: MEM\n",uVar7 & 0xffffffff);
            *left = *left - (long)iVar3;
            sVar5 = (long)iVar3 + *cur;
            *cur = sVar5;
            if (*(uint *)(pcVar8 + -0xc) != 0) {
              sVar2 = *left;
              pcVar4 = cs_reg_name(handle,*(uint *)(pcVar8 + -0xc));
              iVar3 = snprintf(buf + sVar5,sVar2,"\t\t\toperands[%u].mem.base: REG = %s\n",
                               uVar7 & 0xffffffff,pcVar4);
              *left = *left - (long)iVar3;
              sVar5 = (long)iVar3 + *cur;
              *cur = sVar5;
            }
            if (*(uint *)(pcVar8 + -8) != 0) {
              sVar2 = *left;
              pcVar4 = cs_reg_name(handle,*(uint *)(pcVar8 + -8));
              iVar3 = snprintf(buf + sVar5,sVar2,"\t\t\toperands[%u].mem.index: REG = %s\n",
                               uVar7 & 0xffffffff,pcVar4);
              *left = *left - (long)iVar3;
              sVar5 = (long)iVar3 + *cur;
              *cur = sVar5;
            }
            if (*(uint *)(pcVar8 + -4) != 1) {
              iVar3 = snprintf(buf + sVar5,*left,"\t\t\toperands[%u].mem.scale: %u\n",
                               uVar7 & 0xffffffff);
              *left = *left - (long)iVar3;
              sVar5 = (long)iVar3 + *cur;
              *cur = sVar5;
            }
            uVar6 = (ulong)*(uint *)pcVar8;
            if (*(uint *)pcVar8 != 0) {
              __s = buf + sVar5;
              sVar5 = *left;
              pcVar4 = "\t\t\toperands[%u].mem.disp: 0x%x\n";
              goto LAB_001438de;
            }
            goto LAB_001438f0;
          case 4:
            iVar3 = snprintf(buf + *cur,*left,"\t\toperands[%u].type: FP = %f\n",
                             *(undefined8 *)(pcVar8 + -0xc),uVar7 & 0xffffffff);
            break;
          default:
            if (uVar1 == 0x40) {
              __s = buf + *cur;
              sVar5 = *left;
              uVar6 = (ulong)*(uint *)(pcVar8 + -0xc);
              pcVar4 = "\t\toperands[%u].type: C-IMM = %u\n";
            }
            else {
              if (uVar1 != 0x41) goto LAB_001438f0;
              __s = buf + *cur;
              sVar5 = *left;
              uVar6 = (ulong)*(uint *)(pcVar8 + -0xc);
              pcVar4 = "\t\toperands[%u].type: P-IMM = %u\n";
            }
LAB_001438de:
            iVar3 = snprintf(__s,sVar5,pcVar4,uVar7 & 0xffffffff,uVar6);
          }
          *left = *left - (long)iVar3;
          *cur = *cur + (long)iVar3;
LAB_001438f0:
          uVar1 = *(uint *)(pcVar8 + -0x18);
          if ((uVar1 != 0) && (*(uint *)(pcVar8 + -0x14) != 0)) {
            sVar5 = *cur;
            sVar2 = *left;
            if (uVar1 < 6) {
              iVar3 = snprintf(buf + sVar5,sVar2,"\t\t\tShift: %u = %u\n",(ulong)uVar1);
            }
            else {
              pcVar4 = cs_reg_name(handle,*(uint *)(pcVar8 + -0x14));
              iVar3 = snprintf(buf + sVar5,sVar2,"\t\t\tShift: %u = %s\n",(ulong)uVar1,pcVar4);
            }
            *left = *left - (long)iVar3;
            *cur = *cur + (long)iVar3;
          }
          uVar7 = uVar7 + 1;
          pcVar8 = pcVar8 + 0x28;
        } while (uVar7 < (byte)ins->op_str[0xe]);
      }
    }
    if ((*(int *)(ins->op_str + 2) != 0) && (*(int *)(ins->op_str + 2) != 0xf)) {
      iVar3 = snprintf(buf + *cur,*left,"\tCode condition: %u\n");
      *left = *left - (long)iVar3;
      *cur = *cur + (long)iVar3;
    }
    if (ins->op_str[6] == '\x01') {
      iVar3 = snprintf(buf + *cur,*left,"\tUpdate-flags: True\n");
      *left = *left - (long)iVar3;
      *cur = *cur + (long)iVar3;
    }
    if (ins->op_str[7] == '\x01') {
      iVar3 = snprintf(buf + *cur,*left,"\tWrite-back: True\n");
      *left = *left - (long)iVar3;
      *cur = *cur + (long)iVar3;
    }
  }
  return;
}

Assistant:

static void snprint_insn_detail(char * buf, size_t * cur, size_t * left, cs_insn *ins)
{
	size_t used = 0;

#define _this_printf(...) \
	{ \
		size_t used = 0; \
		used = snprintf(buf + *cur, *left, __VA_ARGS__); \
		*left -= used; \
		*cur += used; \
	}

	cs_arm *arm;
	int i;

	// detail can be NULL on "data" instruction if SKIPDATA option is turned ON
	if (ins->detail == NULL)
		return;

	arm = &(ins->detail->arm);

	if (arm->op_count)
		_this_printf("\top_count: %u\n", arm->op_count);

	for (i = 0; i < arm->op_count; i++) {
		cs_arm_op *op = &(arm->operands[i]);
		switch((int)op->type) {
			default:
				break;
			case ARM_OP_REG:
				_this_printf("\t\toperands[%u].type: REG = %s\n", i, cs_reg_name(handle, op->reg));
				break;
			case ARM_OP_IMM:
				_this_printf("\t\toperands[%u].type: IMM = 0x%x\n", i, op->imm);
				break;
			case ARM_OP_FP:
				_this_printf("\t\toperands[%u].type: FP = %f\n", i, op->fp);
				break;
			case ARM_OP_MEM:
				_this_printf("\t\toperands[%u].type: MEM\n", i);
				if (op->mem.base != X86_REG_INVALID)
					_this_printf("\t\t\toperands[%u].mem.base: REG = %s\n",
							i, cs_reg_name(handle, op->mem.base));
				if (op->mem.index != X86_REG_INVALID)
					_this_printf("\t\t\toperands[%u].mem.index: REG = %s\n",
							i, cs_reg_name(handle, op->mem.index));
				if (op->mem.scale != 1)
					_this_printf("\t\t\toperands[%u].mem.scale: %u\n", i, op->mem.scale);
				if (op->mem.disp != 0)
					_this_printf("\t\t\toperands[%u].mem.disp: 0x%x\n", i, op->mem.disp);

				break;
			case ARM_OP_PIMM:
				_this_printf("\t\toperands[%u].type: P-IMM = %u\n", i, op->imm);
				break;
			case ARM_OP_CIMM:
				_this_printf("\t\toperands[%u].type: C-IMM = %u\n", i, op->imm);
				break;
		}

		if (op->shift.type != ARM_SFT_INVALID && op->shift.value) {
			if (op->shift.type < ARM_SFT_ASR_REG) {
				// shift with constant value
				_this_printf("\t\t\tShift: %u = %u\n", op->shift.type, op->shift.value);
			} else {
				// shift with register
				_this_printf("\t\t\tShift: %u = %s\n", op->shift.type,
						cs_reg_name(handle, op->shift.value));
			}
		}
	}

	if (arm->cc != ARM_CC_AL && arm->cc != ARM_CC_INVALID) {
		_this_printf("\tCode condition: %u\n", arm->cc);
	}

	if (arm->update_flags) {
		_this_printf("\tUpdate-flags: True\n");
	}

	if (arm->writeback) {
		_this_printf("\tWrite-back: True\n");
	}

#undef _this_printf
}